

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form3_Flip(FlipForm3 Flip)

{
  uint8_t uVar1;
  bool bVar2;
  uint uVar3;
  code *in_RDI;
  uint uVar4;
  Image output;
  uint32_t yCorrection;
  uint32_t xCorrection;
  bool verticalFlip;
  bool horizontalFlip;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  undefined4 in_stack_fffffffffffffea8;
  uint32_t in_stack_fffffffffffffeac;
  uint in_stack_fffffffffffffeb0;
  undefined2 in_stack_fffffffffffffeb4;
  uint8_t in_stack_fffffffffffffeb6;
  uint8_t in_stack_fffffffffffffeb7;
  uint32_t in_stack_fffffffffffffeb8;
  uint32_t in_stack_fffffffffffffebc;
  uint32_t in_stack_fffffffffffffec0;
  uint32_t in_stack_fffffffffffffec4;
  uint32_t in_stack_fffffffffffffec8;
  uint32_t in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  uint32_t in_stack_fffffffffffffed4;
  uint32_t in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  uint32_t in_stack_fffffffffffffef8;
  uint32_t in_stack_fffffffffffffefc;
  uint in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  uint32_t in_stack_ffffffffffffff08;
  uint32_t in_stack_ffffffffffffff0c;
  undefined1 local_c8 [40];
  uint local_a0;
  uint local_9c;
  byte local_96;
  byte local_95;
  uint local_94;
  uint local_90;
  uint32_t local_8c;
  uint32_t local_88;
  undefined1 local_50 [40];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  code *local_10;
  byte local_1;
  
  uVar1 = (uint8_t)((uint)in_stack_fffffffffffffedc >> 0x18);
  local_10 = in_RDI;
  Unit_Test::intensityArray(in_stack_fffffffffffffeac);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),in_stack_fffffffffffffebc
             ,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb6);
  Test_Helper::uniformImage
            (uVar1,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
             (Image *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d4aa7);
  Unit_Test::generateRoi
            ((Image *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             (uint32_t *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
             (uint32_t *)
             CONCAT17(in_stack_fffffffffffffeb7,
                      CONCAT16(in_stack_fffffffffffffeb6,
                               CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))),
             (uint32_t *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             (uint32_t *)0x1d4ad4);
  uVar1 = (uint8_t)(in_stack_fffffffffffffebc >> 0x18);
  uVar3 = Test_Helper::randomValue<unsigned_int>
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  local_95 = uVar3 == 0;
  uVar3 = Test_Helper::randomValue<unsigned_int>
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  local_96 = uVar3 == 0;
  local_9c = local_90 & 1;
  local_a0 = local_94 & 1;
  if ((bool)local_96) {
    if (1 < local_94) {
      in_stack_ffffffffffffff08 = local_88;
      in_stack_ffffffffffffff0c = local_8c;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,1);
      Image_Function::Fill
                ((Image *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                 in_stack_fffffffffffffec0,uVar1);
    }
  }
  else if (((local_95 & 1) != 0) && (1 < local_90)) {
    in_stack_ffffffffffffff00 = local_90 >> 1;
    in_stack_fffffffffffffef8 = local_88;
    in_stack_fffffffffffffefc = local_8c;
    in_stack_ffffffffffffff04 = local_94;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,1);
    Image_Function::Fill
              ((Image *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
               in_stack_fffffffffffffec0,uVar1);
  }
  uVar4 = local_96 & 1;
  uVar3 = local_95 & 1;
  (*local_10)(local_c8,local_50,local_88,local_8c,local_90,local_94);
  uVar1 = Unit_Test::equalSize
                    ((Image *)CONCAT17(in_stack_fffffffffffffeb7,
                                       CONCAT16(in_stack_fffffffffffffeb6,
                                                CONCAT24(in_stack_fffffffffffffeb4,uVar4))),
                     in_stack_fffffffffffffeac,uVar3);
  if ((bool)uVar1) {
    if ((local_96 & 1) == 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
      bVar2 = Unit_Test::verifyImage
                        ((Image *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                         in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,
                         in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,uVar1);
      if (!bVar2) {
        local_1 = 0;
        goto LAB_001d4f9a;
      }
      if (1 < local_90) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                  (&local_28,(ulong)(local_95 & 1));
        bVar2 = Unit_Test::verifyImage
                          ((Image *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,
                           in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,uVar1);
        in_stack_fffffffffffffec4 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffec4);
        in_stack_fffffffffffffec0 = local_94;
        if (!bVar2) {
          local_1 = 0;
          goto LAB_001d4f9a;
        }
      }
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
      bVar2 = Unit_Test::verifyImage
                        ((Image *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                         in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,
                         in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,uVar1);
      if (!bVar2) {
        local_1 = 0;
        goto LAB_001d4f9a;
      }
      if (1 < local_94) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,1);
        bVar2 = Unit_Test::verifyImage
                          ((Image *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,
                           in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,uVar1);
        if (!bVar2) {
          local_1 = 0;
          goto LAB_001d4f9a;
        }
      }
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
LAB_001d4f9a:
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d4fa7);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d4fb4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  return (bool)(local_1 & 1);
}

Assistant:

bool form3_Flip(FlipForm3 Flip)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        PenguinV_Image::Image input = uniformImage( intensity[0] );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const bool horizontalFlip = (randomValue<uint32_t>( 0, 2 ) == 0);
        const bool verticalFlip = (randomValue<uint32_t>( 0, 2 ) == 0);
        const uint32_t xCorrection = roiWidth % 2;
        const uint32_t yCorrection = roiHeight % 2;

        if (verticalFlip)
        {
            if (roiHeight > 1)
                Image_Function::Fill(input, roiX, roiY, roiWidth, roiHeight / 2, intensity[1]);
        }
        else if (horizontalFlip)
        {
            if (roiWidth > 1)
                Image_Function::Fill(input, roiX, roiY, roiWidth / 2, roiHeight, intensity[1]);
        }

        const PenguinV_Image::Image output = Flip( input, roiX, roiY, roiWidth, roiHeight, horizontalFlip, verticalFlip );

        if( !equalSize( output, roiWidth, roiHeight ))
            return false;

        if (verticalFlip) {
            if( !verifyImage( output, 0, 0, roiWidth, roiHeight / 2 + yCorrection, intensity[0] ) )
                return false;
            if((roiHeight > 1) && !verifyImage( output, 0, roiHeight / 2 + yCorrection, roiWidth, roiHeight / 2, intensity[1] ) )
                return false;
        }
        else {
            if( !verifyImage( output, 0, 0, roiWidth / 2 + xCorrection, roiHeight, intensity[0] ) )
                return false;
            if((roiWidth > 1) && !verifyImage( output, roiWidth / 2 + xCorrection, 0, roiWidth / 2, roiHeight, intensity[horizontalFlip ? 1 : 0] ) )
                return false;
        }

        return true;
    }